

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O1

void pbrt::detail::
     stringPrintfRecursive<std::map<std::__cxx11::string,pbrt::InstanceDefinitionSceneEntity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pbrt::InstanceDefinitionSceneEntity>>>const&,std::vector<pbrt::LightSceneEntity,std::allocator<pbrt::LightSceneEntity>>const&,std::vector<pbrt::ShapeSceneEntity,std::allocator<pbrt::ShapeSceneEntity>>const&,std::vector<pbrt::InstanceSceneEntity,std::allocator<pbrt::InstanceSceneEntity>>const&>
               (string *s,char *fmt,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
               *v,vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_> *args,
               vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *args_1,
               vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_> *args_2
               )

{
  vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_> *args_1_00;
  string *s_00;
  _Alloc_hider __format;
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  _Base_ptr p_Var5;
  char *pcVar6;
  char cVar7;
  _Rb_tree_header *p_Var8;
  string ret;
  string s_1;
  string nextFmt;
  stringstream ss;
  string local_240;
  char *local_220;
  long local_218;
  undefined2 local_210;
  undefined1 uStack_20e;
  undefined5 uStack_20d;
  vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *local_200;
  vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_> *local_1f8;
  vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_> *local_1f0;
  string *local_1e8;
  string local_1e0;
  char *local_1c0;
  char *local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f0 = args;
  local_1e8 = s;
  local_1c0 = fmt;
  copyToFormatString(&local_1e0,&local_1c0,s);
  cVar7 = (char)&local_1e0;
  lVar2 = std::__cxx11::string::find(cVar7,0x2a);
  lVar3 = std::__cxx11::string::find(cVar7,0x73);
  lVar4 = std::__cxx11::string::find(cVar7,100);
  if (lVar2 == -1) {
    if (lVar4 == -1) {
      if (lVar3 != -1) {
        local_200 = args_1;
        local_1f8 = args_2;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        local_220 = (char *)&local_210;
        local_210 = 0x205b;
        local_218 = 2;
        uStack_20e = 0;
        p_Var5 = (v->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var8 = &(v->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var5 != p_Var8) {
          do {
            local_240._M_string_length = 0;
            local_240.field_2._M_local_buf[0] = '\0';
            local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
            stringPrintfRecursive<std::__cxx11::string_const&,pbrt::InstanceDefinitionSceneEntity_const&>
                      (&local_240,"%s:%s ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var5 + 1),(InstanceDefinitionSceneEntity *)(p_Var5 + 2));
            std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_240._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p,
                              CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                                       local_240.field_2._M_local_buf[0]) + 1);
            }
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
          } while ((_Rb_tree_header *)p_Var5 != p_Var8);
        }
        std::__cxx11::string::append((char *)&local_220);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_220,local_218);
        if (local_220 != (char *)&local_210) {
          operator_delete(local_220,CONCAT53(uStack_20d,CONCAT12(uStack_20e,local_210)) + 1);
        }
        __format._M_p = local_1e0._M_dataplus._M_p;
        std::__cxx11::stringbuf::str();
        pcVar6 = local_220;
        iVar1 = snprintf((char *)0x0,0,__format._M_p,local_220);
        local_240._M_string_length = 0;
        local_240.field_2._M_local_buf[0] = '\0';
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        std::__cxx11::string::resize((ulong)&local_240,(char)(iVar1 + 1));
        snprintf(local_240._M_dataplus._M_p,(long)(iVar1 + 1),__format._M_p,pcVar6);
        std::__cxx11::string::pop_back();
        s_00 = local_1e8;
        std::__cxx11::string::_M_append((char *)local_1e8,(ulong)local_240._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,
                          CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                                   local_240.field_2._M_local_buf[0]) + 1);
        }
        args_1_00 = local_1f8;
        if (local_220 != (char *)&local_210) {
          operator_delete(local_220,CONCAT53(uStack_20d,CONCAT12(uStack_20e,local_210)) + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        stringPrintfRecursive<std::vector<pbrt::LightSceneEntity,std::allocator<pbrt::LightSceneEntity>>const&,std::vector<pbrt::ShapeSceneEntity,std::allocator<pbrt::ShapeSceneEntity>>const&,std::vector<pbrt::InstanceSceneEntity,std::allocator<pbrt::InstanceSceneEntity>>const&>
                  (s_00,local_1c0,local_1f0,local_200,args_1_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        return;
      }
      if (local_1e0._M_string_length != 0) {
        local_1b8[0] = local_1e0._M_dataplus._M_p;
        local_240._M_dataplus._M_p =
             "St3mapINSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEN4pbrt29InstanceDefinitionSceneEntityESt4lessIS5_ESaISt4pairIKS5_S7_EEE"
        ;
        LogFatal<char_const*,char_const*&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print.h"
                   ,0xb2,"Printf: Non-basic type %s passed for format string %s",(char **)&local_240
                   ,local_1b8);
      }
      pcVar6 = "Excess values passed to Printf.";
      iVar1 = 0x10d;
    }
    else {
      pcVar6 = "Non-integral type passed to %d format.";
      iVar1 = 0x104;
    }
  }
  else {
    pcVar6 = "Non-integral type provided for %* format.";
    iVar1 = 0xe8;
  }
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print.h"
           ,iVar1,pcVar6);
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}